

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Var __thiscall GlobOpt::GetConstantVar(GlobOpt *this,Opnd *opnd,Value *val)

{
  _func_int **value;
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  OpndKind OVar5;
  uint uVar6;
  int iVar7;
  VarConstantValueInfo *pVVar8;
  ValueInfo *this_00;
  undefined4 *puVar9;
  uint64 uVar10;
  uint64 uVar11;
  RegOpnd *pRVar12;
  AddrOpnd *pAVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FloatConstOpnd *pFVar14;
  ValueType *this_01;
  Instr *pIVar15;
  
  this_00 = val->valueInfo;
  bVar3 = ValueInfo::IsVarConstant(this_00);
  if ((bVar3) && (bVar3 = ValueType::IsPrimitive(&this_00->super_ValueType), bVar3)) {
    pVVar8 = ValueInfo::AsVarConstant(this_00);
    return pVVar8->varValue;
  }
  OVar4 = IR::Opnd::GetKind(opnd);
  OVar5 = IR::Opnd::GetKind(opnd);
  if (OVar4 == OpndKindAddr) {
    if (OVar5 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      this_00 = (ValueInfo *)__tls_get_addr(&PTR_0155fe48);
      *(undefined4 *)&this_00->_vptr_ValueInfo = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar3) {
LAB_0046162b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)&this_00->_vptr_ValueInfo = 0;
    }
    bVar1 = *(byte *)((long)&opnd[2].m_valueType.field_0.bits + 1);
    if ((bVar1 == 10) || (bVar1 == 1)) {
      this_00 = (ValueInfo *)opnd[2]._vptr_Opnd;
    }
    if (bVar1 == 1) {
      return this_00;
    }
    if (bVar1 == 10) {
      return this_00;
    }
  }
  else {
    OVar4 = IR::Opnd::GetKind(opnd);
    if (OVar5 == OpndKindIntConst) {
      if (OVar4 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar3) goto LAB_0046162b;
        *puVar9 = 0;
      }
      IR::IntConstOpnd::AsInt32((IntConstOpnd *)opnd);
      OVar4 = IR::Opnd::GetKind(opnd);
      if (OVar4 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar3) goto LAB_0046162b;
        *puVar9 = 0;
      }
      uVar6 = IR::IntConstOpnd::AsInt32((IntConstOpnd *)opnd);
      return (Var)((ulong)uVar6 | 0x1000000000000);
    }
    OVar5 = IR::Opnd::GetKind(opnd);
    if (OVar4 == OpndKindFloatConst) {
      if (OVar5 != OpndKindFloatConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x107,"(this->IsFloatConstOpnd())","Bad call to AsFloatConstOpnd()");
        if (!bVar3) goto LAB_0046162b;
        *puVar9 = 0;
      }
      value = opnd[1]._vptr_Opnd;
      uVar10 = Js::NumberUtilities::ToSpecial((double)value);
      bVar3 = Js::NumberUtilities::IsNan((double)value);
      if (((bVar3) &&
          (uVar11 = Js::NumberUtilities::ToSpecial((double)value), uVar11 != 0xfff8000000000000)) &&
         (uVar11 = Js::NumberUtilities::ToSpecial((double)value), uVar11 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Library/JavascriptNumber.inl"
                           ,0xa2,
                           "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                           ,"We should only produce a NaN with this value");
        if (!bVar3) goto LAB_0046162b;
        *puVar9 = 0;
      }
      return (Var)(uVar10 ^ 0xfffc000000000000);
    }
    if (OVar5 == OpndKindReg) {
      OVar4 = IR::Opnd::GetKind(opnd);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar3) goto LAB_0046162b;
        *puVar9 = 0;
      }
      if ((((ulong)opnd[1]._vptr_Opnd[3] & 1) != 0) && (opnd[1]._vptr_Opnd[5] != (_func_int *)0x0))
      {
        this_01 = &this_00->super_ValueType;
        bVar3 = ValueType::IsBoolean(this_01);
        if (bVar3) {
          pRVar12 = IR::Opnd::AsRegOpnd(opnd);
          pIVar15 = (Instr *)0x0;
          if ((pRVar12->m_sym->field_0x18 & 1) != 0) {
            pIVar15 = (pRVar12->m_sym->field_5).m_instrDef;
          }
          if (pIVar15->m_opcode != Ld_A) {
            return (Var)0x0;
          }
          OVar4 = IR::Opnd::GetKind(pIVar15->m_src1);
          if (OVar4 == OpndKindAddr) {
            pAVar13 = IR::Opnd::AsAddrOpnd(pIVar15->m_src1);
            if ((pAVar13->addrOpndKind != AddrOpndKindConstantVar) &&
               (pAVar13->addrOpndKind != AddrOpndKindDynamicVar)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar9 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x1a14,"(defInstr->GetSrc1()->AsAddrOpnd()->IsVar())",
                                 "defInstr->GetSrc1()->AsAddrOpnd()->IsVar()");
              if (!bVar3) goto LAB_0046162b;
              *puVar9 = 0;
            }
            pAVar13 = IR::Opnd::AsAddrOpnd(pIVar15->m_src1);
            return pAVar13->m_address;
          }
        }
        else {
          bVar3 = ValueType::IsUndefined(this_01);
          if (bVar3) {
            iVar7 = (*this->func->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
            return (Var)CONCAT44(extraout_var,iVar7);
          }
          bVar3 = ValueType::IsNull(this_01);
          if (bVar3) {
            iVar7 = (**this->func->m_scriptContextInfo->_vptr_ScriptContextInfo)();
            return (Var)CONCAT44(extraout_var_00,iVar7);
          }
          bVar3 = ValueType::IsFloat(this_01);
          if (bVar3) {
            pRVar12 = IR::Opnd::AsRegOpnd(opnd);
            if ((pRVar12->m_sym->field_0x18 & 1) == 0) {
              pIVar15 = (Instr *)0x0;
            }
            else {
              pIVar15 = (pRVar12->m_sym->field_5).m_instrDef;
            }
            bVar3 = true;
            if (((pIVar15->m_opcode & ~ExtendedOpcodePrefix) == LdC_A_R8) &&
               (OVar4 = IR::Opnd::GetKind(pIVar15->m_src1), OVar4 == OpndKindFloatConst)) {
              pFVar14 = IR::Opnd::AsFloatConstOpnd(pIVar15->m_src1);
              this_01 = (ValueType *)Js::JavascriptNumber::ToVar(pFVar14->m_value);
              bVar3 = false;
            }
            if (!bVar3) {
              return this_01;
            }
          }
        }
      }
    }
  }
  return (Var)0x0;
}

Assistant:

Js::Var // TODO: michhol OOP JIT, shouldn't play with Vars
GlobOpt::GetConstantVar(IR::Opnd *opnd, Value *val)
{
    ValueInfo *valueInfo = val->GetValueInfo();

    if (valueInfo->IsVarConstant() && valueInfo->IsPrimitive())
    {
        return valueInfo->AsVarConstant()->VarValue();
    }
    if (opnd->IsAddrOpnd())
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
        if (addrOpnd->IsVar())
        {
            return addrOpnd->m_address;
        }
    }
    else if (opnd->IsIntConstOpnd())
    {
        if (!Js::TaggedInt::IsOverflow(opnd->AsIntConstOpnd()->AsInt32()))
        {
            return Js::TaggedInt::ToVarUnchecked(opnd->AsIntConstOpnd()->AsInt32());
        }
    }
#if FLOATVAR
    else if (opnd->IsFloatConstOpnd())
    {
        return Js::JavascriptNumber::ToVar(opnd->AsFloatConstOpnd()->m_value);
    }
#endif
    else if (opnd->IsRegOpnd() && opnd->AsRegOpnd()->m_sym->IsSingleDef())
    {
        if (valueInfo->IsBoolean())
        {
            IR::Instr * defInstr = opnd->AsRegOpnd()->m_sym->GetInstrDef();

            if (defInstr->m_opcode != Js::OpCode::Ld_A || !defInstr->GetSrc1()->IsAddrOpnd())
            {
                return nullptr;
            }
            Assert(defInstr->GetSrc1()->AsAddrOpnd()->IsVar());
            return defInstr->GetSrc1()->AsAddrOpnd()->m_address;
        }
        else if (valueInfo->IsUndefined())
        {
            return (Js::Var)this->func->GetScriptContextInfo()->GetUndefinedAddr();
        }
        else if (valueInfo->IsNull())
        {
            return (Js::Var)this->func->GetScriptContextInfo()->GetNullAddr();
        }
#if FLOATVAR
        else if (valueInfo->IsFloat())
        {
            IR::Instr * defInstr = opnd->AsRegOpnd()->m_sym->GetInstrDef();
            if ((defInstr->m_opcode == Js::OpCode::LdC_F8_R8 || defInstr->m_opcode == Js::OpCode::LdC_A_R8) && defInstr->GetSrc1()->IsFloatConstOpnd())
            {
                return Js::JavascriptNumber::ToVar(defInstr->GetSrc1()->AsFloatConstOpnd()->m_value);
            }
        }
#endif
    }

    return nullptr;
}